

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::
strTree<char_const(&)[5],char_const(&)[3],kj::CappedArray<char,17ul>,char_const(&)[19],unsigned_long,char_const(&)[3],unsigned_int,char_const(&)[11]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [5],char (*params_1) [3],
          CappedArray<char,_17UL> *params_2,char (*params_3) [19],unsigned_long *params_4,
          char (*params_5) [3],uint *params_6,char (*params_7) [11])

{
  ArrayPtr<const_char> *params_7_00;
  ArrayPtr<const_char> local_d0;
  ArrayPtr<const_char> local_c0;
  ArrayPtr<const_char> local_b0;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  CappedArray<char,_26UL> local_70;
  CappedArray<char,_14UL> local_48;
  
  local_d0 = toCharSequence<char_const(&)[5]>((char (*) [5])this);
  local_80 = toCharSequence<char_const(&)[3]>((char (*) [3])params);
  local_90.size_ = *(size_t *)params_1;
  local_90.ptr = params_1[2] + 2;
  local_a0 = toCharSequence<char_const(&)[19]>((char (*) [19])params_2);
  toCharSequence<unsigned_long>(&local_70,(unsigned_long *)params_3);
  local_b0 = toCharSequence<char_const(&)[3]>((char (*) [3])params_4);
  toCharSequence<unsigned_int>(&local_48,(uint *)params_5);
  params_7_00 = (ArrayPtr<const_char> *)0x163789;
  local_c0 = toCharSequence<char_const(&)[11]>((char (*) [11])params_6);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_d0,&local_80,&local_90,&local_a0,
             (ArrayPtr<const_char> *)&local_70,(CappedArray<char,_26UL> *)&local_b0,
             (ArrayPtr<const_char> *)&local_48,(CappedArray<char,_14UL> *)&local_c0,params_7_00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}